

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_send.c
# Opt level: O0

ares_status_t
ares_send_nolock(ares_channel_t *channel,ares_server_t *server,ares_send_flags_t flags,
                ares_dns_record_t *dnsrec,ares_callback_dnsrec callback,void *arg,
                unsigned_short *qid)

{
  ares_bool_t aVar1;
  size_t sVar2;
  ares_llist_node_t *paVar3;
  ares_dns_record_t *local_68;
  ares_dns_record_t *dnsrec_resp;
  undefined1 local_58 [2];
  unsigned_short id;
  ares_status_t status;
  ares_timeval_t now;
  ares_query_t *query;
  void *arg_local;
  ares_callback_dnsrec callback_local;
  ares_dns_record_t *dnsrec_local;
  ares_send_flags_t flags_local;
  ares_server_t *server_local;
  ares_channel_t *channel_local;
  
  dnsrec_resp._2_2_ = generate_unique_qid(channel);
  local_68 = (ares_dns_record_t *)0x0;
  ares_tvnow((ares_timeval_t *)local_58);
  sVar2 = ares_slist_len(channel->servers);
  if (sVar2 == 0) {
    (*callback)(arg,ARES_ENOSERVER,0,(ares_dns_record_t *)0x0);
    channel_local._4_4_ = ARES_ENOSERVER;
  }
  else {
    if ((flags & ARES_SEND_FLAG_NOCACHE) == 0) {
      dnsrec_resp._4_4_ = ares_qcache_fetch(channel,(ares_timeval_t *)local_58,dnsrec,&local_68);
      if (dnsrec_resp._4_4_ != ARES_ENOTFOUND) {
        (*callback)(arg,dnsrec_resp._4_4_,0,local_68);
        return dnsrec_resp._4_4_;
      }
      dnsrec_resp._4_4_ = 4;
    }
    now._8_8_ = ares_malloc(0x90);
    if ((void *)now._8_8_ == (void *)0x0) {
      (*callback)(arg,ARES_ENOMEM,0,(ares_dns_record_t *)0x0);
      channel_local._4_4_ = ARES_ENOMEM;
    }
    else {
      memset((void *)now._8_8_,0,0x90);
      *(ares_channel_t **)(now._8_8_ + 0x28) = channel;
      *(unsigned_short *)now._8_8_ = dnsrec_resp._2_2_;
      *(undefined8 *)(now._8_8_ + 0x18) = 0;
      *(undefined4 *)(now._8_8_ + 0x20) = 0;
      *(uint *)(now._8_8_ + 0x78) = (uint)((channel->flags & 1) != 0);
      dnsrec_resp._4_4_ =
           ares_dns_record_duplicate_ex((ares_dns_record_t **)(now._8_8_ + 0x50),dnsrec);
      if (dnsrec_resp._4_4_ == ARES_SUCCESS) {
        ares_dns_record_set_id(*(ares_dns_record_t **)(now._8_8_ + 0x50),dnsrec_resp._2_2_);
        if (((channel->flags & 0x400) != 0) && (*(int *)(now._8_8_ + 0x78) == 0)) {
          dnsrec_resp._4_4_ = ares_apply_dns0x20(channel,*(ares_dns_record_t **)(now._8_8_ + 0x50));
          if (dnsrec_resp._4_4_ != ARES_SUCCESS) {
            (*callback)(arg,dnsrec_resp._4_4_,0,(ares_dns_record_t *)0x0);
            ares_free_query((ares_query_t *)now._8_8_);
            return dnsrec_resp._4_4_;
          }
          dnsrec_resp._4_4_ = ARES_SUCCESS;
        }
        *(ares_callback_dnsrec *)(now._8_8_ + 0x58) = callback;
        *(void **)(now._8_8_ + 0x60) = arg;
        *(undefined8 *)(now._8_8_ + 0x68) = 0;
        if ((flags & ARES_SEND_FLAG_NORETRY) != 0) {
          *(undefined4 *)(now._8_8_ + 0x88) = 1;
        }
        *(undefined4 *)(now._8_8_ + 0x7c) = 0;
        *(undefined8 *)(now._8_8_ + 0x80) = 0;
        *(undefined8 *)(now._8_8_ + 0x30) = 0;
        *(undefined8 *)(now._8_8_ + 0x38) = 0;
        paVar3 = ares_llist_insert_last(channel->all_queries,(void *)now._8_8_);
        *(ares_llist_node_t **)(now._8_8_ + 0x40) = paVar3;
        if (*(long *)(now._8_8_ + 0x40) == 0) {
          (*callback)(arg,ARES_ENOMEM,0,(ares_dns_record_t *)0x0);
          ares_free_query((ares_query_t *)now._8_8_);
          channel_local._4_4_ = ARES_ENOMEM;
        }
        else {
          aVar1 = ares_htable_szvp_insert
                            (channel->queries_by_qid,(ulong)*(ushort *)now._8_8_,(void *)now._8_8_);
          if (aVar1 == ARES_FALSE) {
            (*callback)(arg,ARES_ENOMEM,0,(ares_dns_record_t *)0x0);
            ares_free_query((ares_query_t *)now._8_8_);
            channel_local._4_4_ = ARES_ENOMEM;
          }
          else {
            channel_local._4_4_ =
                 ares_send_query(server,(ares_query_t *)now._8_8_,(ares_timeval_t *)local_58);
            if ((channel_local._4_4_ == ARES_SUCCESS) && (qid != (unsigned_short *)0x0)) {
              *qid = dnsrec_resp._2_2_;
            }
          }
        }
      }
      else {
        if (dnsrec_resp._4_4_ == ARES_EBADRESP) {
          dnsrec_resp._4_4_ = ARES_EBADQUERY;
        }
        ares_free((void *)now._8_8_);
        (*callback)(arg,dnsrec_resp._4_4_,0,(ares_dns_record_t *)0x0);
        channel_local._4_4_ = dnsrec_resp._4_4_;
      }
    }
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_send_nolock(ares_channel_t *channel, ares_server_t *server,
                               ares_send_flags_t        flags,
                               const ares_dns_record_t *dnsrec,
                               ares_callback_dnsrec callback, void *arg,
                               unsigned short *qid)
{
  ares_query_t            *query;
  ares_timeval_t           now;
  ares_status_t            status;
  unsigned short           id          = generate_unique_qid(channel);
  const ares_dns_record_t *dnsrec_resp = NULL;

  ares_tvnow(&now);

  if (ares_slist_len(channel->servers) == 0) {
    callback(arg, ARES_ENOSERVER, 0, NULL);
    return ARES_ENOSERVER;
  }

  if (!(flags & ARES_SEND_FLAG_NOCACHE)) {
    /* Check query cache */
    status = ares_qcache_fetch(channel, &now, dnsrec, &dnsrec_resp);
    if (status != ARES_ENOTFOUND) {
      /* ARES_SUCCESS means we retrieved the cache, anything else is a critical
       * failure, all result in termination */
      callback(arg, status, 0, dnsrec_resp);
      return status;
    }
  }

  /* Allocate space for query and allocated fields. */
  query = ares_malloc(sizeof(ares_query_t));
  if (!query) {
    callback(arg, ARES_ENOMEM, 0, NULL); /* LCOV_EXCL_LINE: OutOfMemory */
    return ARES_ENOMEM;                  /* LCOV_EXCL_LINE: OutOfMemory */
  }
  memset(query, 0, sizeof(*query));

  query->channel      = channel;
  query->qid          = id;
  query->timeout.sec  = 0;
  query->timeout.usec = 0;
  query->using_tcp =
    (channel->flags & ARES_FLAG_USEVC) ? ARES_TRUE : ARES_FALSE;

  /* Duplicate Query */
  status = ares_dns_record_duplicate_ex(&query->query, dnsrec);
  if (status != ARES_SUCCESS) {
    /* Sometimes we might get a EBADRESP response from duplicate due to
     * the way it works (write and parse), rewrite it to EBADQUERY. */
    if (status == ARES_EBADRESP) {
      status = ARES_EBADQUERY;
    }
    ares_free(query);
    callback(arg, status, 0, NULL);
    return status;
  }

  ares_dns_record_set_id(query->query, id);

  if (channel->flags & ARES_FLAG_DNS0x20 && !query->using_tcp) {
    status = ares_apply_dns0x20(channel, query->query);
    if (status != ARES_SUCCESS) {
      /* LCOV_EXCL_START: OutOfMemory */
      callback(arg, status, 0, NULL);
      ares_free_query(query);
      return status;
      /* LCOV_EXCL_STOP */
    }
  }

  /* Fill in query arguments. */
  query->callback = callback;
  query->arg      = arg;

  /* Initialize query status. */
  query->try_count = 0;

  if (flags & ARES_SEND_FLAG_NORETRY) {
    query->no_retries = ARES_TRUE;
  }

  query->error_status = ARES_SUCCESS;
  query->timeouts     = 0;

  /* Initialize our list nodes. */
  query->node_queries_by_timeout = NULL;
  query->node_queries_to_conn    = NULL;

  /* Chain the query into the list of all queries. */
  query->node_all_queries = ares_llist_insert_last(channel->all_queries, query);
  if (query->node_all_queries == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    callback(arg, ARES_ENOMEM, 0, NULL);
    ares_free_query(query);
    return ARES_ENOMEM;
    /* LCOV_EXCL_STOP */
  }

  /* Keep track of queries bucketed by qid, so we can process DNS
   * responses quickly.
   */
  if (!ares_htable_szvp_insert(channel->queries_by_qid, query->qid, query)) {
    /* LCOV_EXCL_START: OutOfMemory */
    callback(arg, ARES_ENOMEM, 0, NULL);
    ares_free_query(query);
    return ARES_ENOMEM;
    /* LCOV_EXCL_STOP */
  }

  /* Perform the first query action. */

  status = ares_send_query(server, query, &now);
  if (status == ARES_SUCCESS && qid) {
    *qid = id;
  }
  return status;
}